

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::trySwap
          (HeapStoreOptimization *this,ExpressionList *list,Index i,Index j)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  LocalSet *pLVar4;
  Expression **__b;
  undefined1 local_2e8 [8];
  EffectAnalyzer secondEffects;
  EffectAnalyzer firstEffects;
  Index j_local;
  Index i_local;
  ExpressionList *list_local;
  HeapStoreOptimization *this_local;
  
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&list->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if ((ulong)j == sVar2 - 1) {
    this_local._7_1_ = false;
  }
  else {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)j);
    bVar1 = Expression::is<wasm::LocalSet>(*ppEVar3);
    if (bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)j);
      pLVar4 = Expression::dynCast<wasm::LocalSet>(*ppEVar3);
      bVar1 = Expression::is<wasm::StructNew>(pLVar4->value);
      if (bVar1) {
        return false;
      }
    }
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)i);
    effects((EffectAnalyzer *)
            &secondEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
            *ppEVar3);
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)j);
    effects((EffectAnalyzer *)local_2e8,this,*ppEVar3);
    bVar1 = EffectAnalyzer::invalidates
                      ((EffectAnalyzer *)local_2e8,
                       (EffectAnalyzer *)
                       &secondEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
    if (!bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)i);
      __b = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                      (&list->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (ulong)j);
      std::swap<wasm::Expression*>(ppEVar3,__b);
    }
    this_local._7_1_ = !bVar1;
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2e8);
    EffectAnalyzer::~EffectAnalyzer
              ((EffectAnalyzer *)
               &secondEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return this_local._7_1_;
}

Assistant:

bool trySwap(ExpressionList& list, Index i, Index j) {
    if (j == list.size() - 1) {
      // There is no reason to swap with the last element of the list as it
      // won't match the pattern because there wont be anything after. This also
      // avoids swapping an instruction that does not leave anything in the
      // stack by one that could leave something, and that which would be
      // incorrect.
      return false;
    }

    if (list[j]->is<LocalSet>() &&
        list[j]->dynCast<LocalSet>()->value->is<StructNew>()) {
      // Don't swap two struct.new instructions to avoid going back and forth.
      return false;
    }
    // Check if the two expressions can be swapped safely considering their
    // effects.
    auto firstEffects = effects(list[i]);
    auto secondEffects = effects(list[j]);
    if (secondEffects.invalidates(firstEffects)) {
      return false;
    }

    std::swap(list[i], list[j]);
    return true;
  }